

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_enctropy.c
# Opt level: O0

RK_U8 sbacInit(RK_S32 qp,RK_S32 initValue)

{
  int iVar1;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  RK_U8 m_state;
  RK_U32 mpState;
  RK_S32 initState;
  RK_S32 offset;
  RK_S32 slope;
  RK_S32 initValue_local;
  RK_S32 qp_local;
  
  iVar1 = (initValue >> 4) * 5 + -0x2d;
  local_30 = (initValue & 0xfU) * 8 + -0x10;
  if ((iVar1 * qp >> 4) + local_30 < 1) {
    local_28 = 1;
  }
  else {
    local_28 = (iVar1 * qp >> 4) + local_30;
  }
  if (local_28 < 0x7f) {
    if ((iVar1 * qp >> 4) + local_30 < 1) {
      local_30 = 1;
    }
    else {
      local_30 = (iVar1 * qp >> 4) + local_30;
    }
    local_2c = local_30;
  }
  else {
    local_2c = 0x7e;
  }
  if (0x3f < local_2c) {
    local_34 = local_2c + -0x40;
  }
  else {
    local_34 = 0x3f - local_2c;
  }
  return (char)(local_34 << 1) + (0x3f < local_2c);
}

Assistant:

RK_U8 sbacInit(RK_S32 qp, RK_S32 initValue)
{
    RK_S32  slope      = (initValue >> 4) * 5 - 45;
    RK_S32  offset     = ((initValue & 15) << 3) - 16;
    RK_S32  initState  =  MPP_MIN(MPP_MAX(1, (((slope * qp) >> 4) + offset)), 126);
    RK_U32  mpState = (initState >= 64);
    RK_U8   m_state = ((mpState ? (initState - 64) : (63 - initState)) << 1) + mpState;

    return m_state;
}